

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int btreeRestoreCursorPosition(BtCursor *pCur)

{
  int *piVar1;
  int iVar2;
  int skipNext;
  uint local_c;
  
  if (pCur->eState == '\x04') {
    iVar2 = pCur->skipNext;
  }
  else {
    pCur->eState = '\0';
    iVar2 = btreeMoveto(pCur,pCur->pKey,pCur->nKey,0,(int *)&local_c);
    if (iVar2 == 0) {
      sqlite3_free(pCur->pKey);
      pCur->pKey = (void *)0x0;
      piVar1 = &pCur->skipNext;
      *piVar1 = *piVar1 | local_c;
      if ((*piVar1 != 0) && (pCur->eState == '\x01')) {
        pCur->eState = '\x02';
      }
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

static int btreeRestoreCursorPosition(BtCursor *pCur){
  int rc;
  int skipNext;
  assert( cursorOwnsBtShared(pCur) );
  assert( pCur->eState>=CURSOR_REQUIRESEEK );
  if( pCur->eState==CURSOR_FAULT ){
    return pCur->skipNext;
  }
  pCur->eState = CURSOR_INVALID;
  rc = btreeMoveto(pCur, pCur->pKey, pCur->nKey, 0, &skipNext);
  if( rc==SQLITE_OK ){
    sqlite3_free(pCur->pKey);
    pCur->pKey = 0;
    assert( pCur->eState==CURSOR_VALID || pCur->eState==CURSOR_INVALID );
    pCur->skipNext |= skipNext;
    if( pCur->skipNext && pCur->eState==CURSOR_VALID ){
      pCur->eState = CURSOR_SKIPNEXT;
    }
  }
  return rc;
}